

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O3

void __thiscall tcmalloc::GenericWriter::AppendMem(GenericWriter *this,char *str,size_t sz)

{
  char *__dest;
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  char *extraout_RDX;
  size_t __n;
  undefined4 extraout_var;
  
  __dest = this->buf_fill_;
  pcVar3 = this->buf_end_;
  while( true ) {
    uVar1 = 0x7fffffff;
    if (sz < 0x7fffffff) {
      uVar1 = sz;
    }
    iVar2 = (int)pcVar3 - (int)__dest;
    if ((int)uVar1 <= iVar2) {
      iVar2 = (int)uVar1;
    }
    if (iVar2 == 0) {
      __n = 0;
    }
    else {
      __n = (size_t)iVar2;
      memcpy(__dest,str,__n);
      __dest = this->buf_fill_;
    }
    this->buf_fill_ = __dest + __n;
    sz = sz - __n;
    if (sz == 0) break;
    str = str + __n;
    iVar2 = (*this->_vptr_GenericWriter[2])(this,this->buf_,__dest + __n,1);
    __dest = (char *)CONCAT44(extraout_var,iVar2);
    this->buf_ = __dest;
    this->buf_end_ = extraout_RDX;
    this->buf_fill_ = __dest;
    pcVar3 = extraout_RDX;
  }
  return;
}

Assistant:

void GenericWriter::AppendMem(const char* str, size_t sz) {
  for (;;) {
    // first, cap amount to be at most MAX_INT
    int amount = static_cast<int>(std::min<size_t>(std::numeric_limits<int>::max(), sz));
    amount = std::min<int>(amount, buf_end_ - buf_fill_);

    // So this is silly but ultimately harmless. Glibc defines memcpy
    // args to be non-null (so, even for the amount == 0 case). And
    // while in practice it works (and has to), ubsan kinda complains.
    //
    // Thankfully in this place we can afford slight perf hit of doing
    // "stupid" thing.
    if (PREDICT_TRUE(amount != 0)) {
      memcpy(buf_fill_, str, amount);
    }

    str += amount;
    buf_fill_ += amount;
    sz -= amount;

    if (sz == 0) {
      return;
    }

    std::tie(buf_, buf_end_) = RecycleBuffer(buf_, buf_fill_, 1);
    buf_fill_ = buf_;
  }
}